

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_daemon.c
# Opt level: O2

int zt_daemonize(char *root,mode_t mask,int options)

{
  __pid_t _Var1;
  int iVar2;
  int iVar3;
  int *piVar4;
  char *fmt;
  zt_log_level level;
  ulong uVar5;
  int status;
  rlim_t rStack_30;
  
  _Var1 = fork();
  if (_Var1 == 0) {
    _Var1 = setsid();
    if (_Var1 == -1) {
      piVar4 = __errno_location();
      root = strerror(*piVar4);
      fmt = "faild to setsid(): %s";
      goto LAB_00121b26;
    }
    _status = 0;
    rStack_30 = 0;
    iVar2 = getrlimit(RLIMIT_NOFILE,(rlimit *)&status);
    if (iVar2 == -1) {
      piVar4 = __errno_location();
      root = strerror(*piVar4);
      fmt = "faild to getlimit(): %s";
      goto LAB_00121b26;
    }
    for (uVar5 = 0; uVar5 < _status; uVar5 = uVar5 + 1) {
      if (0x7ffffffe < uVar5) {
        uVar5 = 0x7fffffff;
      }
      close((int)uVar5);
    }
    _Var1 = fork();
    if (_Var1 != 0) {
      if (_Var1 != -1) {
        sleep(1);
        goto LAB_00121af7;
      }
      goto LAB_00121b34;
    }
    if (root == (char *)0x0) {
LAB_00121a61:
      umask(mask);
      iVar2 = open("/dev/null",2);
      iVar3 = dup(iVar2);
      if (iVar3 == -1) {
        zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"Could not send stdout to /dev/null");
      }
      iVar2 = dup(iVar2);
      if (iVar2 == -1) {
        zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"Could not send stderr to /dev/null");
      }
      return 0;
    }
    iVar2 = chdir(root);
    if (iVar2 == 0) goto LAB_00121a61;
    fmt = "Could not chdir %s";
    level = zt_log_crit;
  }
  else {
    if (_Var1 != -1) {
      wait(&status);
LAB_00121af7:
      exit(0);
    }
    piVar4 = __errno_location();
    root = strerror(*piVar4);
    fmt = "failed to fork(): %s";
LAB_00121b26:
    level = zt_log_emerg;
  }
  zt_log_lprintf((zt_log_ty *)0x0,level,fmt,root);
LAB_00121b34:
  exit(1);
}

Assistant:

int
zt_daemonize( char *root, mode_t mask, int options UNUSED)
{
    pid_t         pid;
    pid_t         pid2;
    rlim_t        i;
    int           status;
    struct rlimit rlimits;

    if ((pid = fork()) == (pid_t)(-1)) { /* first error */
        zt_log_printf(zt_log_emerg, "failed to fork(): %s", strerror(errno));
        exit(1);
    } else if (pid == 0) {  /* first child */
        /* FIXME: Not everyone has setsid.  Add support for them. */
        if (setsid() == -1) {
            zt_log_printf(zt_log_emerg, "faild to setsid(): %s", strerror(errno));
            exit(1);
        }

        /* get the max number of open fd and close them */
        memset(&rlimits, 0, sizeof(struct rlimit));
        if (getrlimit(RLIMIT_NOFILE, &rlimits) == -1) {
            zt_log_printf(zt_log_emerg, "faild to getlimit(): %s", strerror(errno));
            exit(1);
        }
        for (i = 0; i < rlimits.rlim_cur; i++) {
            if (i > INT_MAX) {
                /* int cast protection */
                i = INT_MAX;
            }
            close((int)i);
        }                                                  /* Close all of the filehandles */

        if ((pid2 = fork()) == (pid_t)(-1)) {
            /* We can't produce an error here as we have already
             * closed all of the file descriptors
             */
            exit(1);
        } else if (pid2 == 0) { /* second child */
            int fd;

            if (root != NULL) {
                if(chdir(root) != 0) {
                    zt_log_printf(zt_log_crit, "Could not chdir %s", root);
                    exit(1);
                }
            }
            umask(mask);
            fd = open("/dev/null", O_RDWR);    /* stdin */

            /* we don't care about the results as we have no open pids at this point */
            if(dup(fd) == -1) { /* stdout */
              zt_log_printf(zt_log_crit, "Could not send stdout to /dev/null");
            }

            if(dup(fd) == -1) { /* stderr */
              zt_log_printf(zt_log_crit, "Could not send stderr to /dev/null");
            }

        } else {                                           /* second parent */
            sleep(1);
            exit(0);
        }
    } else {    /* first parent */
        /* wait here for the first child to exit */
        wait(&status);
        exit(0);
    }

    /* At this point we are in the second child properly forked and closed off */
    return 0;
}